

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_DCP_MXF.cpp
# Opt level: O1

ostream * ASDCP::operator<<(ostream *strm,WriterInfo *Info)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  char str_buf [40];
  undefined8 local_6f;
  undefined8 uStack_67;
  char local_58 [40];
  
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       ProductUUID: ",0x14);
  local_6f = *(undefined8 *)Info->ProductUUID;
  uStack_67 = *(undefined8 *)(Info->ProductUUID + 8);
  pcVar3 = (char *)Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
  iVar2 = (int)strm;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)strm + -0x18));
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar3,sVar4);
  }
  cVar1 = (char)strm;
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    ProductVersion: ",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,(Info->ProductVersion)._M_dataplus._M_p,
                      (Info->ProductVersion)._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       CompanyName: ",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,(Info->CompanyName)._M_dataplus._M_p,(Info->CompanyName)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"       ProductName: ",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (strm,(Info->ProductName)._M_dataplus._M_p,(Info->ProductName)._M_string_length
                     );
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"  EncryptedEssence: ",0x14);
  pcVar6 = "No";
  pcVar3 = "No";
  if ((ulong)Info->EncryptedEssence != 0) {
    pcVar3 = "Yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar3,(ulong)Info->EncryptedEssence | 2);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  if (Info->EncryptedEssence == true) {
    std::__ostream_insert<char,std::char_traits<char>>(strm,"              HMAC: ",0x14);
    if ((ulong)Info->UsesHMAC != 0) {
      pcVar6 = "Yes";
    }
    std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar6,(ulong)Info->UsesHMAC | 2);
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(strm,"         ContextID: ",0x14);
    local_6f = *(undefined8 *)Info->ContextID;
    uStack_67 = *(undefined8 *)(Info->ContextID + 8);
    pcVar3 = (char *)Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)strm + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(strm,"CryptographicKeyID: ",0x14);
    local_6f = *(undefined8 *)Info->CryptographicKeyID;
    uStack_67 = *(undefined8 *)(Info->CryptographicKeyID + 8);
    pcVar3 = (char *)Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
    if (pcVar3 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)strm + -0x18));
    }
    else {
      sVar4 = strlen(pcVar3);
      std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar3,sVar4);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>(strm,"         AssetUUID: ",0x14);
  local_6f = *(undefined8 *)Info->AssetUUID;
  uStack_67 = *(undefined8 *)(Info->AssetUUID + 8);
  pcVar3 = (char *)Kumu::bin2UUIDhex((uchar *)&local_6f,0x10,local_58,0x28);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)strm + -0x18));
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar3,sVar4);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(strm,"    Label Set Type: ",0x14);
  pcVar3 = "Unknown";
  if (Info->LabelSetType == LS_MXF_INTEROP) {
    pcVar3 = "MXF Interop";
  }
  pcVar6 = "SMPTE";
  if (Info->LabelSetType != LS_MXF_SMPTE) {
    pcVar6 = pcVar3;
  }
  sVar4 = strlen(pcVar6);
  std::__ostream_insert<char,std::char_traits<char>>(strm,pcVar6,sVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)strm + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return strm;
}

Assistant:

std::ostream&
ASDCP::operator << (std::ostream& strm, const WriterInfo& Info)
{
  char str_buf[40];

  strm << "       ProductUUID: " << UUID(Info.ProductUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    ProductVersion: " << Info.ProductVersion << std::endl;
  strm << "       CompanyName: " << Info.CompanyName << std::endl;
  strm << "       ProductName: " << Info.ProductName << std::endl;
  strm << "  EncryptedEssence: " << (Info.EncryptedEssence ? "Yes" : "No") << std::endl;

  if ( Info.EncryptedEssence )
    {
      strm << "              HMAC: " << (Info.UsesHMAC ? "Yes" : "No") << std::endl;
      strm << "         ContextID: " << UUID(Info.ContextID).EncodeHex(str_buf, 40) << std::endl;
      strm << "CryptographicKeyID: " << UUID(Info.CryptographicKeyID).EncodeHex(str_buf, 40) << std::endl;
    }

  strm << "         AssetUUID: " << UUID(Info.AssetUUID).EncodeHex(str_buf, 40) << std::endl;
  strm << "    Label Set Type: " << (Info.LabelSetType == LS_MXF_SMPTE ? "SMPTE" :
				     (Info.LabelSetType == LS_MXF_INTEROP ? "MXF Interop" :
				      "Unknown")) << std::endl;
  return strm;
}